

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_AActor_A_Detonate
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int bombdamage;
  AActor *bombspot;
  AActor *bombsource;
  bool bVar1;
  bool local_43;
  FName local_40;
  int local_3c;
  AActor *pAStack_38;
  int damage;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_18;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_18 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xd52,
                  "int AF_AActor_A_Detonate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    pAStack_38 = (AActor *)(param->field_0).field_1.a;
    local_43 = true;
    if (pAStack_38 != (AActor *)0x0) {
      local_43 = DObject::IsKindOf((DObject *)pAStack_38,AActor::RegistrationInfo.MyClass);
    }
    if (local_43 != false) {
      local_3c = AActor::GetMissileDamage(pAStack_38,0,1);
      bombspot = pAStack_38;
      bombsource = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&pAStack_38->target);
      bombdamage = local_3c;
      FName::FName(&local_40,&(pAStack_38->DamageType).super_FName);
      P_RadiusAttack(bombspot,bombsource,bombdamage,bombdamage,&local_40,1,0);
      P_CheckSplash(pAStack_38,(double)local_3c);
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xd52,
                  "int AF_AActor_A_Detonate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xd52,
                "int AF_AActor_A_Detonate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Detonate)
{
	PARAM_SELF_PROLOGUE(AActor);
	int damage = self->GetMissileDamage(0, 1);
	P_RadiusAttack (self, self->target, damage, damage, self->DamageType, RADF_HURTSOURCE);
	P_CheckSplash(self, damage);
	return 0;
}